

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int gladLoadGL(void)

{
  int iVar1;
  int local_c;
  int status;
  
  local_c = 0;
  iVar1 = open_gl();
  if (iVar1 != 0) {
    local_c = gladLoadGLLoader(get_proc);
    close_gl();
  }
  return local_c;
}

Assistant:

int gladLoadGL(void) {
    int status = 0;

    if(open_gl()) {
        status = gladLoadGLLoader(&get_proc);
        close_gl();
    }

    return status;
}